

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::bitwiseIsEqual(IEEEFloat *this,IEEEFloat *rhs)

{
  bool bVar1;
  uint uVar2;
  integerPart *__first1;
  integerPart *piVar3;
  integerPart *__first2;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this == rhs) {
    this_local._7_1_ = true;
  }
  else if (((this->semantics == rhs->semantics) && ((this->field_0x12 & 7) == (rhs->field_0x12 & 7))
           ) && (((byte)this->field_0x12 >> 3 & 1) == ((byte)rhs->field_0x12 >> 3 & 1))) {
    if (((this->field_0x12 & 7) == 3) || ((this->field_0x12 & 7) == 0)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = isFiniteNonZero(this);
      if ((bVar1) && (this->exponent != rhs->exponent)) {
        this_local._7_1_ = false;
      }
      else {
        __first1 = significandParts(this);
        piVar3 = significandParts(this);
        uVar2 = partCount(this);
        __first2 = significandParts(rhs);
        this_local._7_1_ =
             std::equal<unsigned_long_const*,unsigned_long_const*>(__first1,piVar3 + uVar2,__first2)
        ;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IEEEFloat::bitwiseIsEqual(const IEEEFloat &rhs) const {
  if (this == &rhs)
    return true;
  if (semantics != rhs.semantics ||
      category != rhs.category ||
      sign != rhs.sign)
    return false;
  if (category==fcZero || category==fcInfinity)
    return true;

  if (isFiniteNonZero() && exponent != rhs.exponent)
    return false;

  return std::equal(significandParts(), significandParts() + partCount(),
                    rhs.significandParts());
}